

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O2

void __thiscall bandit::reporter::xunit::it_failed(xunit *this,string *desc,assertion_exception *ex)

{
  failure_formatter_t *pfVar1;
  ostream *poVar2;
  string sStack_68;
  string local_48;
  
  progress_base::it_failed(&this->super_progress_base,desc,ex);
  print_remaining_header_with_time(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x80,"\t\t<failure message=\"");
  pfVar1 = (this->super_progress_base).failure_formatter_;
  (*pfVar1->_vptr_interface[2])(&local_48,pfVar1,ex);
  escape(&sStack_68,this,&local_48);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_68);
  std::operator<<(poVar2,"\" />\n");
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)&this->field_0x80,"\t</testcase>\n");
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        progress_base::it_failed(desc, ex);
        print_remaining_header_with_time();
        work_stm_ << "\t\t<failure message=\"" << escape(failure_formatter_.format(ex)) << "\" />\n";
        work_stm_ << "\t</testcase>\n";
      }